

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Expression * __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
::replaceCurrent(Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                 *this,Expression *expression)

{
  Expression *original;
  Expression *expression_local;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
  *this_local;
  
  if (this->currFunction != (Function *)0x0) {
    original = getCurrent(this);
    debuginfo::copyOriginalToReplacement(original,expression,this->currFunction);
  }
  *this->replacep = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      debuginfo::copyOriginalToReplacement(
        getCurrent(), expression, currFunction);
    }
    return *replacep = expression;
  }